

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O2

double __thiscall imrt::ApertureILS::perturbation(ApertureILS *this,Plan *P)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *__x;
  ostream *poVar5;
  difference_type __d;
  int i;
  int iVar6;
  iterator s;
  double local_88;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  _List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_48;
  
  __x = Plan::get_stations_abi_cxx11_(P);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list(&stations,__x);
  diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&diff;
  diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  _M_node._M_size = 0;
  diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  local_88 = Plan::getEvaluation(P);
  std::operator<<((ostream *)&std::cout,"##  Perturbation: ");
  if (this->perturbation_size == 0) {
    std::operator<<((ostream *)&std::cout,"none");
  }
  else {
    std::__cxx11::
    list<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>::clear
              (&this->tabu);
  }
  for (iVar6 = 0; iVar6 < this->perturbation_size; iVar6 = iVar6 + 1) {
    s._M_node = stations.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl
                ._M_node.super__List_node_base._M_next;
    iVar2 = rand();
    std::__advance<std::_List_iterator<imrt::Station*>,long>
              (&s,(ulong)(long)iVar2 %
                  stations.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                  _M_impl._M_node._M_size);
    iVar2 = rand();
    if ((double)iVar2 / 2147483647.0 <= 0.3) {
      do {
        iVar2 = rand();
        iVar3 = Station::getNbBeamlets((Station *)s._M_node[1]._M_next);
        iVar2 = iVar2 % iVar3;
        bVar1 = Station::isActiveBeamlet((Station *)s._M_node[1]._M_next,iVar2);
      } while (!bVar1);
      iVar3 = rand();
      iVar3 = iVar3 % ((Station *)s._M_node[1]._M_next)->max_apertures;
      bVar1 = Station::isOpenBeamlet((Station *)s._M_node[1]._M_next,iVar2,iVar3);
      if (bVar1) {
        iVar4 = rand();
        if ((double)iVar4 / 2147483647.0 <= 0.5) {
          Station::closeBeamlet_abi_cxx11_
                    ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     &local_48,(Station *)s._M_node[1]._M_next,iVar2,iVar3,true);
        }
        else {
          Station::closeBeamlet_abi_cxx11_
                    ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     &local_48,(Station *)s._M_node[1]._M_next,iVar2,iVar3,false);
        }
      }
      else {
        Station::openBeamlet_abi_cxx11_
                  ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   &local_48,(Station *)s._M_node[1]._M_next,iVar2,iVar3);
      }
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      _M_move_assign(&diff,&local_48);
      std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      _M_clear(&local_48);
      local_88 = Plan::incremental_eval(P,(Station *)s._M_node[1]._M_next,&diff);
      poVar5 = std::operator<<((ostream *)&std::cout,"(");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(int *)&(s._M_node[1]._M_next)->_M_prev);
      poVar5 = std::operator<<(poVar5,",");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
      poVar5 = std::operator<<(poVar5,",");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
      std::operator<<(poVar5,") ");
    }
    else {
      iVar2 = rand();
      iVar2 = iVar2 % *(int *)&s._M_node[1]._M_next[4]._M_next;
      iVar3 = rand();
      if ((double)iVar3 / 2147483647.0 <= 0.5) {
        Station::modifyIntensityAperture_abi_cxx11_
                  ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   &local_48,(Station *)s._M_node[1]._M_next,iVar2,(double)this->step_intensity);
      }
      else {
        Station::modifyIntensityAperture_abi_cxx11_
                  ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   &local_48,(Station *)s._M_node[1]._M_next,iVar2,(double)-this->step_intensity);
      }
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      _M_move_assign(&diff,&local_48);
      std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      _M_clear(&local_48);
      local_88 = Plan::incremental_eval(P,(Station *)s._M_node[1]._M_next,&diff);
      poVar5 = std::operator<<((ostream *)&std::cout,"(");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(int *)&(s._M_node[1]._M_next)->_M_prev);
      poVar5 = std::operator<<(poVar5,",");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
      std::operator<<(poVar5,") ");
    }
    Station::clearHistory((Station *)s._M_node[1]._M_next);
  }
  std::operator<<((ostream *)&std::cout,", new eval: ");
  poVar5 = std::ostream::_M_insert<double>(local_88);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
  _M_clear(&diff.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)
  ;
  std::__cxx11::_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>::_M_clear
            (&stations.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>);
  return local_88;
}

Assistant:

double ApertureILS::perturbation(Plan& P) {
  list<Station*> stations = P.get_stations();
  int beamlet, aperture;
  list<pair<int,double>> diff;
  double aux_eval=P.getEvaluation();
  
  cout << "##  Perturbation: " ;
  if (perturbation_size==0) cout << "none";   
  else tabu.clear();
  for (int i=0; i<perturbation_size; i++) {
    list<Station*>::iterator s=stations.begin();
    std::advance(s,rand()%stations.size());
    if (((double) rand() / (RAND_MAX)) > 0.3) {
      //Modify intensity
      aperture = (rand()% (*s)->getNbApertures());
      if (((double) rand() / (RAND_MAX)) > 0.5){ 
        diff = (*s)->modifyIntensityAperture(aperture, -step_intensity);
      }else{ 
        diff = (*s)->modifyIntensityAperture(aperture, step_intensity);
      }
      aux_eval = P.incremental_eval(*(*s), diff);
      cout << "(" << (*s)->getAngle() << ","<< aperture<<") ";
    } else {
      //Modify aperture
      do { 
        beamlet = (rand()% (*s)->getNbBeamlets());
      } while (!(*s)->isActiveBeamlet(beamlet));
      aperture = (rand()% (*s)->getNbApertures());
      if ((*s)->isOpenBeamlet(beamlet, aperture)){
        if (((double) rand() / (RAND_MAX)) > 0.5) 
          diff = (*s)->closeBeamlet(beamlet, aperture, false);
        else
          diff = (*s)->closeBeamlet(beamlet, aperture, true);
      } else {
        diff = (*s)->openBeamlet(beamlet, aperture);
      }
      aux_eval = P.incremental_eval(*(*s), diff);
      cout << "(" << (*s)->getAngle() << "," << aperture<< "," << beamlet << ") ";
    }
    (*s)->clearHistory();
  }
  
  //aux_eval = P.eval();
  cout << ", new eval: "<< aux_eval<< endl;
  return(aux_eval);
}